

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveRedundantMaterials.cpp
# Opt level: O2

void __thiscall
Assimp::RemoveRedundantMatsProcess::Execute(RemoveRedundantMatsProcess *this,aiScene *pScene)

{
  uint uVar1;
  aiMesh *paVar2;
  uint i_1;
  uint32_t uVar3;
  aiReturn aVar4;
  Logger *pLVar5;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  void *pvVar7;
  void *pvVar8;
  aiMaterial **__s;
  uint p;
  uint i;
  ulong uVar9;
  ulong uVar10;
  size_type __n;
  aiMaterial *paVar11;
  reference rVar12;
  uint local_62c;
  int local_61c;
  int local_618;
  int dummy;
  vector<bool,_std::allocator<bool>_> abReferenced;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  char *local_5d0 [4];
  aiString name;
  char *local_1a8 [47];
  
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"RemoveRedundantMatsProcess begin");
  if ((ulong)pScene->mNumMaterials == 0) {
    local_618 = 0;
    local_61c = 0;
  }
  else {
    name.length = name.length & 0xffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&abReferenced,(ulong)pScene->mNumMaterials,(bool *)&name,(allocator_type *)local_1a8)
    ;
    for (uVar9 = 0; uVar9 < pScene->mNumMeshes; uVar9 = uVar9 + 1) {
      rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&abReferenced,(ulong)pScene->mMeshes[uVar9]->mMaterialIndex);
      *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
    }
    if ((this->mConfigFixedMaterials)._M_string_length != 0) {
      strings.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size = 0;
      strings.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&strings;
      strings.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&strings;
      ConvertListToStrings(&this->mConfigFixedMaterials,&strings);
      for (uVar9 = 0; uVar9 < pScene->mNumMaterials; uVar9 = uVar9 + 1) {
        paVar11 = pScene->mMaterials[uVar9];
        name.length = 0;
        name.data[0] = '\0';
        memset(name.data + 1,0x1b,0x3ff);
        aiGetMaterialString(paVar11,"?mat.name",0,0,&name);
        if (name.length != 0) {
          _Var6 = std::
                  __find_if<std::_List_iterator<std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const[1024]>>
                            (strings.
                             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl._M_node.super__List_node_base._M_next,
                             (_List_node_base *)&strings,name.data);
          if (_Var6._M_node != (_List_node_base *)&strings) {
            dummy = 1;
            aiMaterial::AddProperty(paVar11,&dummy,1,"~RRM.UniqueMaterial",0,0);
            rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&abReferenced,uVar9);
            *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
            pLVar5 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[42]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,(char (*) [42])"Found positive match in exclusion list: \'");
            std::operator<<((ostream *)local_1a8,name.data);
            std::operator<<((ostream *)local_1a8,"\'");
            std::__cxx11::stringbuf::str();
            Logger::debug(pLVar5,local_5d0[0]);
            std::__cxx11::string::~string((string *)local_5d0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          }
        }
      }
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&strings.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
    }
    uVar10 = (ulong)pScene->mNumMaterials;
    pvVar7 = operator_new__(uVar10 * 4);
    for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      *(undefined4 *)((long)pvVar7 + uVar9 * 4) = 0;
    }
    pvVar8 = operator_new__(uVar10 * 4);
    local_618 = 0;
    local_61c = 0;
    local_62c = 0;
    for (uVar9 = 0; uVar9 < uVar10; uVar9 = uVar9 + 1) {
      rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&abReferenced,uVar9);
      if ((*rVar12._M_p & rVar12._M_mask) == 0) {
        paVar11 = pScene->mMaterials[uVar9];
        if (paVar11 != (aiMaterial *)0x0) {
          aiMaterial::~aiMaterial(paVar11);
        }
        local_618 = local_618 + 1;
LAB_003b0a5b:
        operator_delete(paVar11,0x10);
        pScene->mMaterials[uVar9] = (aiMaterial *)0x0;
      }
      else {
        uVar3 = ComputeMaterialHash(pScene->mMaterials[uVar9],false);
        *(uint32_t *)((long)pvVar8 + uVar9 * 4) = uVar3;
        for (__n = 0; uVar9 != __n; __n = __n + 1) {
          rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&abReferenced,__n);
          if (((*rVar12._M_p & rVar12._M_mask) != 0) &&
             (uVar3 == *(uint32_t *)((long)pvVar8 + __n * 4))) {
            *(undefined4 *)((long)pvVar7 + uVar9 * 4) = *(undefined4 *)((long)pvVar7 + __n * 4);
            paVar11 = pScene->mMaterials[uVar9];
            if (paVar11 != (aiMaterial *)0x0) {
              aiMaterial::~aiMaterial(paVar11);
            }
            local_61c = local_61c + 1;
            goto LAB_003b0a5b;
          }
        }
        if (uVar3 != 0) {
          *(uint *)((long)pvVar7 + uVar9 * 4) = local_62c;
          local_62c = local_62c + 1;
        }
      }
      uVar10 = (ulong)pScene->mNumMaterials;
    }
    if (local_62c != (uint)uVar10) {
      if (local_62c == 0) {
        __assert_fail("iNewNum > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/RemoveRedundantMaterials.cpp"
                      ,0xaf,"virtual void Assimp::RemoveRedundantMatsProcess::Execute(aiScene *)");
      }
      __s = (aiMaterial **)operator_new__((ulong)local_62c << 3);
      memset(__s,0,(ulong)local_62c << 3);
      for (uVar9 = 0; uVar9 < uVar10; uVar9 = uVar9 + 1) {
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&abReferenced,uVar9);
        if ((*rVar12._M_p & rVar12._M_mask) != 0) {
          uVar1 = *(uint *)((long)pvVar7 + uVar9 * 4);
          paVar11 = __s[uVar1];
          if (paVar11 == (aiMaterial *)0x0) {
            __s[uVar1] = pScene->mMaterials[uVar9];
          }
          else {
            name.length = 0;
            name.data[0] = '\0';
            memset(name.data + 1,0x1b,0x3ff);
            aVar4 = aiGetMaterialString(paVar11,"?mat.name",0,0,&name);
            if (aVar4 != aiReturn_SUCCESS) {
              name.length = snprintf(name.data,0x400,"JoinedMaterial_#%u");
              aiMaterial::AddProperty(paVar11,&name,"?mat.name",0,0);
            }
          }
        }
        uVar10 = (ulong)pScene->mNumMaterials;
      }
      for (uVar9 = 0; uVar9 < pScene->mNumMeshes; uVar9 = uVar9 + 1) {
        paVar2 = pScene->mMeshes[uVar9];
        if (paVar2 == (aiMesh *)0x0) {
          __assert_fail("__null!=mesh",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/RemoveRedundantMaterials.cpp"
                        ,200,"virtual void Assimp::RemoveRedundantMatsProcess::Execute(aiScene *)");
        }
        paVar2->mMaterialIndex = *(uint *)((long)pvVar7 + (ulong)paVar2->mMaterialIndex * 4);
      }
      if (pScene->mMaterials != (aiMaterial **)0x0) {
        operator_delete__(pScene->mMaterials);
      }
      pScene->mMaterials = __s;
      pScene->mNumMaterials = local_62c;
    }
    operator_delete__(pvVar8);
    operator_delete__(pvVar7);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&abReferenced.super__Bvector_base<std::allocator<bool>_>);
  }
  pLVar5 = DefaultLogger::get();
  if (local_61c == 0 && local_618 == 0) {
    Logger::debug(pLVar5,"RemoveRedundantMatsProcess finished ");
  }
  else {
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[46]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
               (char (*) [46])"RemoveRedundantMatsProcess finished. Removed ");
    std::ostream::_M_insert<unsigned_long>((ulong)&name);
    std::operator<<((ostream *)&name," redundant and ");
    std::ostream::_M_insert<unsigned_long>((ulong)&name);
    std::operator<<((ostream *)&name," unused materials.");
    std::__cxx11::stringbuf::str();
    Logger::info(pLVar5,local_1a8[0]);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
  }
  return;
}

Assistant:

void RemoveRedundantMatsProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("RemoveRedundantMatsProcess begin");

    unsigned int redundantRemoved = 0, unreferencedRemoved = 0;
    if (pScene->mNumMaterials)
    {
        // Find out which materials are referenced by meshes
        std::vector<bool> abReferenced(pScene->mNumMaterials,false);
        for (unsigned int i = 0;i < pScene->mNumMeshes;++i)
            abReferenced[pScene->mMeshes[i]->mMaterialIndex] = true;

        // If a list of materials to be excluded was given, match the list with
        // our imported materials and 'salt' all positive matches to ensure that
        // we get unique hashes later.
        if (mConfigFixedMaterials.length()) {

            std::list<std::string> strings;
            ConvertListToStrings(mConfigFixedMaterials,strings);

            for (unsigned int i = 0; i < pScene->mNumMaterials;++i) {
                aiMaterial* mat = pScene->mMaterials[i];

                aiString name;
                mat->Get(AI_MATKEY_NAME,name);

                if (name.length) {
                    std::list<std::string>::const_iterator it = std::find(strings.begin(), strings.end(), name.data);
                    if (it != strings.end()) {

                        // Our brilliant 'salt': A single material property with ~ as first
                        // character to mark it as internal and temporary.
                        const int dummy = 1;
                        ((aiMaterial*)mat)->AddProperty(&dummy,1,"~RRM.UniqueMaterial",0,0);

                        // Keep this material even if no mesh references it
                        abReferenced[i] = true;
                        ASSIMP_LOG_DEBUG_F( "Found positive match in exclusion list: \'", name.data, "\'");
                    }
                }
            }
        }

        // TODO: re-implement this algorithm to work in-place
        unsigned int *aiMappingTable = new unsigned int[pScene->mNumMaterials];
        for ( unsigned int i=0; i<pScene->mNumMaterials; i++ ) {
            aiMappingTable[ i ] = 0;
        }
        unsigned int iNewNum = 0;

        // Iterate through all materials and calculate a hash for them
        // store all hashes in a list and so a quick search whether
        // we do already have a specific hash. This allows us to
        // determine which materials are identical.
        uint32_t *aiHashes = new uint32_t[ pScene->mNumMaterials ];;
        for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
        {
            // No mesh is referencing this material, remove it.
            if (!abReferenced[i]) {
                ++unreferencedRemoved;
                delete pScene->mMaterials[i];
                pScene->mMaterials[i] = nullptr;
                continue;
            }

            // Check all previously mapped materials for a matching hash.
            // On a match we can delete this material and just make it ref to the same index.
            uint32_t me = aiHashes[i] = ComputeMaterialHash(pScene->mMaterials[i]);
            for (unsigned int a = 0; a < i;++a)
            {
                if (abReferenced[a] && me == aiHashes[a]) {
                    ++redundantRemoved;
                    me = 0;
                    aiMappingTable[i] = aiMappingTable[a];
                    delete pScene->mMaterials[i];
                    pScene->mMaterials[i] = nullptr;
                    break;
                }
            }
            // This is a new material that is referenced, add to the map.
            if (me) {
                aiMappingTable[i] = iNewNum++;
            }
        }
        // If the new material count differs from the original,
        // we need to rebuild the material list and remap mesh material indexes.
        if (iNewNum != pScene->mNumMaterials) {
            ai_assert(iNewNum > 0);
            aiMaterial** ppcMaterials = new aiMaterial*[iNewNum];
            ::memset(ppcMaterials,0,sizeof(void*)*iNewNum);
            for (unsigned int p = 0; p < pScene->mNumMaterials;++p)
            {
                // if the material is not referenced ... remove it
                if (!abReferenced[p]) {
                    continue;
                }

                // generate new names for modified materials that had no names
                const unsigned int idx = aiMappingTable[p];
                if (ppcMaterials[idx]) {
                    aiString sz;
                    if( ppcMaterials[idx]->Get(AI_MATKEY_NAME, sz) != AI_SUCCESS ) {
                        sz.length = ::ai_snprintf(sz.data,MAXLEN,"JoinedMaterial_#%u",p);
                        ((aiMaterial*)ppcMaterials[idx])->AddProperty(&sz,AI_MATKEY_NAME);
                    }
                } else {
                    ppcMaterials[idx] = pScene->mMaterials[p];
                }
            }
            // update all material indices
            for (unsigned int p = 0; p < pScene->mNumMeshes;++p) {
                aiMesh* mesh = pScene->mMeshes[p];
                ai_assert( NULL!=mesh );
                mesh->mMaterialIndex = aiMappingTable[mesh->mMaterialIndex];
            }
            // delete the old material list
            delete[] pScene->mMaterials;
            pScene->mMaterials = ppcMaterials;
            pScene->mNumMaterials = iNewNum;
        }
        // delete temporary storage
        delete[] aiHashes;
        delete[] aiMappingTable;
    }
    if (redundantRemoved == 0 && unreferencedRemoved == 0)
    {
        ASSIMP_LOG_DEBUG("RemoveRedundantMatsProcess finished ");
    }
    else
    {
        ASSIMP_LOG_INFO_F("RemoveRedundantMatsProcess finished. Removed ", redundantRemoved, " redundant and ", 
            unreferencedRemoved, " unused materials.");
    }
}